

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_node_mapping_sort_cmp_default(fy_node_pair *fynp_a,fy_node_pair *fynp_b,void *arg)

{
  fy_node *pfVar1;
  fy_node *pfVar2;
  fy_token *pfVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  anon_union_16_3_aa7ec5a3_for_fy_node_12 *paVar9;
  fy_token *pfVar10;
  code *UNRECOVERED_JUMPTABLE;
  bool bVar11;
  bool bVar12;
  
  if (arg == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = fy_node_scalar_cmp_default;
    uVar8 = 0;
  }
  else {
    UNRECOVERED_JUMPTABLE = *arg;
    uVar8 = *(undefined8 *)((long)arg + 8);
  }
  pfVar1 = fynp_a->key;
  bVar12 = true;
  bVar11 = true;
  if (pfVar1 != (fy_node *)0x0) {
    bVar11 = (pfVar1->field_0x34 & 3) == 0;
  }
  pfVar2 = fynp_b->key;
  if (pfVar2 != (fy_node *)0x0) {
    bVar12 = (pfVar2->field_0x34 & 3) == 0;
  }
  if (((bool)(bVar11 ^ 1U)) || ((bool)(bVar12 ^ 1U))) {
    iVar5 = -1;
    if (((bool)(bVar11 | bVar12 ^ 1U)) && (iVar5 = 1, (bool)(bVar11 ^ 1U | bVar12))) {
      bVar4 = pfVar1->field_0x34 & 3;
      if (bVar4 == (pfVar2->field_0x34 & 3)) {
        pfVar10 = (fynp_a->parent->field_12).scalar;
        paVar9 = &fynp_a->parent->field_12;
        iVar7 = -1;
        if (pfVar10 != (fy_token *)0x0 && pfVar10 != (fy_token *)paVar9) {
          iVar7 = 0;
          do {
            if (pfVar10 == (fy_token *)fynp_a) goto LAB_0011dd5f;
            pfVar3 = (fy_token *)(pfVar10->node).next;
            pfVar10 = (fy_token *)0x0;
            if (pfVar3 != (fy_token *)paVar9) {
              pfVar10 = pfVar3;
            }
            iVar7 = iVar7 + 1;
          } while (pfVar10 != (fy_token *)0x0);
          iVar7 = -1;
        }
LAB_0011dd5f:
        pfVar10 = (fynp_b->parent->field_12).scalar;
        paVar9 = &fynp_b->parent->field_12;
        iVar6 = -1;
        if (pfVar10 != (fy_token *)0x0 && pfVar10 != (fy_token *)paVar9) {
          iVar5 = 0;
          do {
            iVar6 = iVar5;
            if (pfVar10 == (fy_token *)fynp_b) break;
            pfVar3 = (fy_token *)(pfVar10->node).next;
            pfVar10 = (fy_token *)0x0;
            if (pfVar3 != (fy_token *)paVar9) {
              pfVar10 = pfVar3;
            }
            iVar5 = iVar5 + 1;
            iVar6 = -1;
          } while (pfVar10 != (fy_token *)0x0);
        }
        iVar5 = 1;
        if (iVar7 <= iVar6) {
          iVar5 = -(uint)(iVar7 < iVar6);
        }
      }
      else {
        iVar5 = (uint)(bVar4 != 2) * 2 + -1;
      }
    }
  }
  else {
    if ((pfVar1 == (fy_node *)0x0) || ((pfVar1->field_0x34 & 3) != 0)) {
      bVar12 = false;
    }
    else {
      bVar12 = pfVar1->style == FYNS_ALIAS;
    }
    if ((pfVar2 == (fy_node *)0x0) || ((pfVar2->field_0x34 & 3) != 0)) {
      bVar11 = false;
    }
    else {
      bVar11 = pfVar2->style == FYNS_ALIAS;
    }
    if (((!bVar12) || (iVar5 = -1, bVar11)) && (iVar5 = 1, bVar12 || bVar11 != true)) {
      iVar5 = (*UNRECOVERED_JUMPTABLE)(pfVar1,pfVar2,uVar8,pfVar2,pfVar1,UNRECOVERED_JUMPTABLE);
      return iVar5;
    }
  }
  return iVar5;
}

Assistant:

static int fy_node_mapping_sort_cmp_default(const struct fy_node_pair *fynp_a,
                                            const struct fy_node_pair *fynp_b,
                                            void *arg) {
    int idx_a, idx_b;
    bool alias_a, alias_b, scalar_a, scalar_b;
    struct fy_node_cmp_arg *cmp_arg;
    fy_node_scalar_compare_fn cmp_fn;
    void *cmp_fn_arg;

    cmp_arg = arg;
    cmp_fn = cmp_arg ? cmp_arg->cmp_fn : fy_node_scalar_cmp_default;
    cmp_fn_arg = cmp_arg ? cmp_arg->arg : NULL;

    /* order is: maps first, followed by sequences, and last scalars sorted */
    scalar_a = !fynp_a->key || fy_node_is_scalar(fynp_a->key);
    scalar_b = !fynp_b->key || fy_node_is_scalar(fynp_b->key);

    /* scalar? perform comparison */
    if (scalar_a && scalar_b) {

        /* if both are aliases, sort skipping the '*' */
        alias_a = fy_node_is_alias(fynp_a->key);
        alias_b = fy_node_is_alias(fynp_b->key);

        /* aliases win */
        if (alias_a && !alias_b)
            return -1;

        if (!alias_a && alias_b)
            return 1;

        return cmp_fn(fynp_a->key, fynp_b->key, cmp_fn_arg);
    }

    /* b is scalar, a is not */
    if (!scalar_a && scalar_b)
        return -1;

    /* a is scalar, b is not */
    if (scalar_a && !scalar_b)
        return 1;

    /* different types, mappings win */
    if (fynp_a->key->type != fynp_b->key->type)
        return fynp_a->key->type == FYNT_MAPPING ? -1 : 1;

    /* ok, need to compare indices now */
    idx_a = fy_node_mapping_get_pair_index(fynp_a->parent, fynp_a);
    idx_b = fy_node_mapping_get_pair_index(fynp_b->parent, fynp_b);

    return idx_a > idx_b ? 1 : (idx_a < idx_b ? -1 : 0);
}